

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiViewport_*> *this;
  ImVector<ImGuiWindow_*> *this_00;
  ImVec2 IVar1;
  ImVec2 IVar2;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var3;
  ImGuiViewportP *pIVar4;
  ImGuiWindow *pIVar5;
  char *text;
  ImGuiViewportP **ppIVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  ImU32 IVar14;
  undefined4 extraout_EAX;
  int iVar15;
  ImGuiWindow *pIVar16;
  ImDrawList *pIVar17;
  char *pcVar18;
  byte bVar19;
  ulong uVar20;
  ImGuiWindow *pIVar21;
  byte bVar22;
  char *label;
  int i;
  ImGuiContext *g;
  int viewport_n;
  long lVar23;
  int i_1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar24;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar25;
  ImRect IVar26;
  ImRect IVar27;
  ImVec2 local_88;
  ImVec2 IStack_80;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar10 = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  p_Var3 = (GImGui->PlatformIO).Platform_SetImeInputPos;
  if (p_Var3 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
    fVar24 = (GImGui->PlatformImeLastPos).x;
    if ((fVar24 != 3.4028235e+38) || (NAN(fVar24))) {
      in_XMM1_Dc = 0;
      in_XMM1_Dd = 0;
      fVar25 = (GImGui->PlatformImePos).y - (GImGui->PlatformImeLastPos).y;
      fVar24 = (GImGui->PlatformImePos).x - fVar24;
      if (fVar24 * fVar24 + fVar25 * fVar25 <= 0.0001) goto LAB_0014e0df;
    }
    pIVar4 = GImGui->PlatformImePosViewport;
    if ((pIVar4 != (ImGuiViewportP *)0x0) && (pIVar4->PlatformWindowCreated == true)) {
      (*p_Var3)(&pIVar4->super_ImGuiViewport,GImGui->PlatformImePos);
      pIVar10->PlatformImeLastPos = pIVar10->PlatformImePos;
      pIVar10->PlatformImePosViewport = (ImGuiViewportP *)0x0;
    }
  }
LAB_0014e0df:
  pIVar9 = GImGui;
  iVar15 = (GImGui->CurrentWindowStack).Size;
  if (1 < iVar15) {
    while (1 < iVar15) {
      End();
      iVar15 = (pIVar9->CurrentWindowStack).Size;
    }
  }
  pIVar10->WithinFrameScopeWithImplicitWindow = false;
  pIVar16 = pIVar10->CurrentWindow;
  if ((pIVar16 != (ImGuiWindow *)0x0) && (pIVar16->WriteAccessed == false)) {
    pIVar16->Active = false;
  }
  End();
  pIVar9 = GImGui;
  pIVar16 = GetTopMostPopupModal();
  if (pIVar16 != (ImGuiWindow *)0x0 || pIVar9->NavWindowingTargetAnim != (ImGuiWindow *)0x0) {
    local_78 = (undefined1  [8])pIVar9->NavWindowingTargetAnim;
    for (lVar23 = 0; lVar23 < (pIVar9->Viewports).Size; lVar23 = lVar23 + 1) {
      pIVar4 = (pIVar9->Viewports).Data[lVar23];
      if ((((pIVar16 == (ImGuiWindow *)0x0) || (pIVar4 != pIVar16->Viewport)) &&
          ((pIVar9->NavWindowingList == (ImGuiWindow *)0x0 ||
           (pIVar4 != pIVar9->NavWindowingList->Viewport)))) &&
         ((pIVar9->NavWindowingTargetAnim == (ImGuiWindow *)0x0 ||
          (pIVar4 != pIVar9->NavWindowingTargetAnim->Viewport)))) {
        pIVar17 = GetForegroundDrawList(&pIVar4->super_ImGuiViewport);
        IVar14 = GetColorU32(0x31 - (uint)(pIVar16 == (ImGuiWindow *)0x0),pIVar9->DimBgRatio);
        IVar1 = (pIVar4->super_ImGuiViewport).Pos;
        IVar2 = (pIVar4->super_ImGuiViewport).Size;
        in_XMM1_Dc = 0;
        in_XMM1_Dd = 0;
        local_88.y = IVar2.y + IVar1.y;
        local_88.x = IVar2.x + IVar1.x;
        ImDrawList::AddRectFilled
                  (pIVar17,&(pIVar4->super_ImGuiViewport).Pos,&local_88,IVar14,0.0,0xf);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      pIVar16 = pIVar9->NavWindowingTargetAnim;
      pIVar5 = pIVar16->RootWindow;
      do {
        pIVar21 = pIVar5;
        uVar20 = (ulong)(uint)(pIVar21->DC).ChildWindows.Size;
        while( true ) {
          if ((int)uVar20 < 1) {
            pIVar17 = pIVar21->DrawList;
            ImDrawList::PushClipRectFullScreen(pIVar17);
            if (((pIVar16->RootWindowDockStop->field_0x43a & 1) != 0) &&
               (pIVar16->RootWindow != pIVar16->RootWindowDockStop)) {
              IVar26 = ImGuiWindow::Rect(pIVar16->RootWindow);
              fStack_70 = (float)in_XMM1_Dc;
              local_78._0_4_ = IVar26.Max.x;
              local_78._4_4_ = IVar26.Max.y;
              fStack_6c = (float)in_XMM1_Dd;
              IVar27 = ImGuiWindow::Rect(pIVar16->RootWindowDockStop);
              local_58._8_4_ = extraout_XMM0_Dc;
              local_58._0_4_ = IVar27.Min.x;
              local_58._4_4_ = IVar27.Min.y;
              local_58._12_4_ = extraout_XMM0_Dd;
              local_68._8_4_ = in_XMM1_Dc;
              local_68._0_4_ = IVar27.Max.x;
              local_68._4_4_ = IVar27.Max.y;
              local_68._12_4_ = in_XMM1_Dd;
              IVar14 = GetColorU32(0x30,pIVar9->DimBgRatio);
              auVar12 = local_58;
              auVar11 = local_68;
              auVar8 = _local_78;
              IVar27.Max.x = (float)local_78._0_4_;
              IVar27.Max.y = (float)local_78._4_4_;
              IVar27.Min = IVar26.Min;
              IVar26.Max.x = (float)local_68._0_4_;
              IVar26.Max.y = (float)local_68._4_4_;
              IVar26.Min.x = (float)local_58._0_4_;
              IVar26.Min.y = (float)local_58._4_4_;
              _local_78 = auVar8;
              local_68 = auVar11;
              local_58 = auVar12;
              RenderRectFilledWithHole(pIVar17,IVar27,IVar26,IVar14,(pIVar9->Style).WindowRounding);
            }
            local_58 = ZEXT416((uint)pIVar16->WindowRounding);
            local_68 = ZEXT416((uint)(pIVar9->Style).WindowRounding);
            IVar26 = ImGuiWindow::Rect(pIVar16);
            fVar24 = pIVar9->FontSize;
            local_48 = IVar26.Min.x - fVar24;
            fStack_44 = IVar26.Min.y - fVar24;
            local_78._4_4_ = fStack_44;
            local_78._0_4_ = local_48;
            fStack_70 = IVar26.Max.x - fVar24;
            fStack_6c = IVar26.Max.y - fVar24;
            fVar25 = fVar24 + IVar26.Max.x;
            fVar24 = fVar24 + IVar26.Max.y;
            local_88.y = fStack_44;
            local_88.x = local_48;
            IStack_80.x = fVar25;
            IStack_80.y = fVar24;
            fStack_40 = fVar25;
            fStack_3c = fVar24;
            IVar26 = ImGuiViewportP::GetRect(pIVar16->Viewport);
            auVar8._4_4_ = -(uint)(IVar26.Max.y <= fVar24);
            auVar8._0_4_ = -(uint)(IVar26.Max.x <= fVar25);
            auVar8._8_4_ = -(uint)(local_78._0_4_ <= IVar26.Min.x);
            auVar8._12_4_ = -(uint)(local_78._4_4_ <= IVar26.Min.y);
            iVar15 = movmskps(extraout_EAX,auVar8);
            if (iVar15 == 0xf) {
              fVar24 = -1.0 - pIVar9->FontSize;
              IStack_80.x = fVar24 + fStack_40;
              IStack_80.y = fVar24 + fStack_3c;
              local_88.y = fStack_44 - fVar24;
              local_88.x = local_48 - fVar24;
              fVar24 = pIVar16->WindowRounding;
            }
            else {
              fVar24 = (float)(~-(uint)((float)local_68._0_4_ <= (float)local_58._0_4_) &
                               local_68._0_4_ |
                              local_58._0_4_ &
                              -(uint)((float)local_68._0_4_ <= (float)local_58._0_4_));
            }
            IVar14 = GetColorU32(0x2f,pIVar9->NavWindowingHighlightAlpha);
            ImDrawList::AddRect(pIVar17,&local_88,&IStack_80,IVar14,fVar24,-1,3.0);
            ImDrawList::PopClipRect(pIVar17);
            goto LAB_0014e3db;
          }
          pIVar5 = (pIVar21->DC).ChildWindows.Data[uVar20 - 1];
          if ((pIVar5->Active == true) && (pIVar5->Hidden != true)) break;
          uVar20 = uVar20 - 1;
        }
      } while( true );
    }
  }
LAB_0014e3db:
  pIVar9 = GImGui;
  if ((pIVar10->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
      pIVar16 = FindWindowByName("###NavWindowingList");
      pIVar9->NavWindowingList = pIVar16;
    }
    pIVar4 = *(pIVar9->Viewports).Data;
    IVar1 = (pIVar4->super_ImGuiViewport).Size;
    IVar2.y = IVar1.y * 0.2;
    IVar2.x = IVar1.x * 0.2;
    (pIVar9->NextWindowData).SizeConstraintRect.Min = IVar2;
    (pIVar9->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar9->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar9->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar9->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar1 = (pIVar4->super_ImGuiViewport).Pos;
    IVar2 = (pIVar4->super_ImGuiViewport).Size;
    (pIVar9->NextWindowData).Flags = (pIVar9->NextWindowData).Flags | 0x11;
    IVar7.y = IVar2.y * 0.5 + IVar1.y;
    IVar7.x = IVar2.x * 0.5 + IVar1.x;
    (pIVar9->NextWindowData).PosVal = IVar7;
    (pIVar9->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar9->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar9->NextWindowData).PosCond = 1;
    (pIVar9->NextWindowData).PosUndock = true;
    IVar1 = (pIVar9->Style).WindowPadding;
    fVar24 = IVar1.x;
    fVar25 = IVar1.y;
    local_88.y = fVar25 + fVar25;
    local_88.x = fVar24 + fVar24;
    PushStyleVar(1,&local_88);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    for (uVar20 = (ulong)(uint)(pIVar9->WindowsFocusOrder).Size; 0 < (int)uVar20;
        uVar20 = uVar20 - 1) {
      pIVar16 = (pIVar9->WindowsFocusOrder).Data[uVar20 - 1];
      bVar13 = IsWindowNavFocusable(pIVar16);
      if (bVar13) {
        text = pIVar16->Name;
        pcVar18 = FindRenderedTextEnd(text,(char *)0x0);
        label = text;
        if (text == pcVar18) {
          label = "(Popup)";
          if (((uint)pIVar16->Flags >> 0x1a & 1) == 0) {
            if (((uint)pIVar16->Flags >> 10 & 1) != 0) {
              iVar15 = strcmp(text,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar15 == 0) goto LAB_0014e561;
            }
            label = "(Dock node)";
            if (pIVar16->DockNodeAsHost == (ImGuiDockNode *)0x0) {
              label = "(Untitled)";
            }
          }
        }
LAB_0014e561:
        local_88.x = 0.0;
        local_88.y = 0.0;
        Selectable(label,pIVar9->NavWindowingTarget == pIVar16,0,&local_88);
      }
    }
    End();
    PopStyleVar(1);
  }
  pIVar9 = GImGui;
  if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
    GImGui->CurrentDpiScale = 1.0;
    pIVar9->CurrentViewport = (ImGuiViewportP *)0x0;
  }
  bVar19 = pIVar10->DragDropActive;
  iVar15 = pIVar10->FrameCount;
  if ((bool)bVar19 != true) goto LAB_0014e614;
  if ((pIVar10->DragDropPayload).DataFrameCount + 1 < iVar15) {
    if ((pIVar10->DragDropSourceFlags & 0x20) == 0) {
      bVar22 = (pIVar9->IO).MouseDown[pIVar10->DragDropMouseButton] ^ 1;
      goto LAB_0014e5fa;
    }
  }
  else {
    bVar22 = 0;
LAB_0014e5fa:
    if ((bVar22 == 0) && ((pIVar10->DragDropPayload).Delivery == false)) goto LAB_0014e614;
  }
  ClearDragDrop();
  bVar19 = pIVar10->DragDropActive;
  iVar15 = pIVar10->FrameCount;
LAB_0014e614:
  if (((bVar19 & 1) != 0) && (pIVar10->DragDropSourceFrameCount < iVar15)) {
    pIVar10->DragDropWithinSourceOrTarget = true;
    SetTooltip("...");
    pIVar10->DragDropWithinSourceOrTarget = false;
    iVar15 = pIVar10->FrameCount;
  }
  pIVar10->WithinFrameScope = false;
  pIVar10->FrameCountEnded = iVar15;
  UpdateMouseMovingWindowEndFrame();
  pIVar9 = GImGui;
  (GImGui->PlatformIO).MainViewport = &(*(GImGui->Viewports).Data)->super_ImGuiViewport;
  this = &(pIVar9->PlatformIO).Viewports;
  lVar23 = 0;
  ImVector<ImGuiViewport_*>::resize(this,0);
  do {
    ppIVar6 = (pIVar9->Viewports).Data;
    if ((pIVar9->Viewports).Size <= lVar23) {
      pIVar4 = *ppIVar6;
      (pIVar4->super_ImGuiViewport).PlatformRequestResize = false;
      (pIVar4->super_ImGuiViewport).PlatformRequestClose = false;
      (pIVar4->super_ImGuiViewport).PlatformRequestMove = false;
      this_00 = &pIVar10->WindowsSortBuffer;
      ImVector<ImGuiWindow_*>::resize(this_00,0);
      ImVector<ImGuiWindow_*>::reserve(this_00,(pIVar10->Windows).Size);
      for (uVar20 = 0; uVar20 != (uint)(pIVar10->Windows).Size; uVar20 = uVar20 + 1) {
        pIVar16 = (pIVar10->Windows).Data[uVar20];
        if ((pIVar16->Active != true) || ((pIVar16->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(this_00,pIVar16);
        }
      }
      ImVector<ImGuiWindow_*>::swap(&pIVar10->Windows,this_00);
      (pIVar10->IO).MetricsActiveWindows = pIVar10->WindowsActiveCount;
      ((pIVar10->IO).Fonts)->Locked = false;
      (pIVar10->IO).MouseWheel = 0.0;
      (pIVar10->IO).MouseWheelH = 0.0;
      ImVector<unsigned_short>::resize(&(pIVar10->IO).InputQueueCharacters,0);
      (pIVar10->IO).NavInputs[0x10] = 0.0;
      (pIVar10->IO).NavInputs[0x11] = 0.0;
      (pIVar10->IO).NavInputs[0x12] = 0.0;
      (pIVar10->IO).NavInputs[0x13] = 0.0;
      (pIVar10->IO).NavInputs[0xc] = 0.0;
      (pIVar10->IO).NavInputs[0xd] = 0.0;
      (pIVar10->IO).NavInputs[0xe] = 0.0;
      (pIVar10->IO).NavInputs[0xf] = 0.0;
      (pIVar10->IO).NavInputs[8] = 0.0;
      (pIVar10->IO).NavInputs[9] = 0.0;
      (pIVar10->IO).NavInputs[10] = 0.0;
      (pIVar10->IO).NavInputs[0xb] = 0.0;
      (pIVar10->IO).NavInputs[4] = 0.0;
      (pIVar10->IO).NavInputs[5] = 0.0;
      (pIVar10->IO).NavInputs[6] = 0.0;
      (pIVar10->IO).NavInputs[7] = 0.0;
      (pIVar10->IO).NavInputs[0] = 0.0;
      (pIVar10->IO).NavInputs[1] = 0.0;
      (pIVar10->IO).NavInputs[2] = 0.0;
      (pIVar10->IO).NavInputs[3] = 0.0;
      (pIVar10->IO).NavInputs[0x14] = 0.0;
      return;
    }
    IVar1 = *(ImVec2 *)(ppIVar6 + lVar23);
    *(ImVec2 *)((long)IVar1 + 0x6c) = *(ImVec2 *)((long)IVar1 + 8);
    if ((*(int *)((long)IVar1 + 0x58) < pIVar9->FrameCount) ||
       (((ImVec2 *)((long)IVar1 + 0x10))->x <= 0.0)) {
      if (lVar23 == 0) goto LAB_0014e6cc;
    }
    else if ((lVar23 == 0) || (0.0 < *(float *)((long)IVar1 + 0x14))) {
LAB_0014e6cc:
      pIVar16 = *(ImGuiWindow **)((long)IVar1 + 0x80);
      if ((pIVar16 == (ImGuiWindow *)0x0) ||
         ((pIVar16->Active == true && (pIVar16->Hidden == false)))) {
        local_88 = IVar1;
        ImVector<ImGuiViewport_*>::push_back(this,(ImGuiViewport **)&local_88);
      }
    }
    lVar23 = lVar23 + 1;
  } while( true );
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    ErrorCheckEndFrame();

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget != NULL)
        NavUpdateWindowingOverlay();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}